

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O3

char * preprocessor_nexttoken(Preprocessor *ctx,uint *len,Token *token)

{
  int *piVar1;
  long lVar2;
  bool bVar3;
  byte bVar4;
  Token TVar5;
  int iVar6;
  uint uVar7;
  undefined4 uVar8;
  size_t sVar9;
  byte *__s1;
  void *__dest;
  Buffer *buffer;
  size_t sVar10;
  undefined8 *puVar11;
  byte *pbVar12;
  byte bVar13;
  ulong uVar14;
  IncludeState *pIVar15;
  char *pcVar16;
  undefined8 uVar17;
  char *pcVar18;
  uint uVar19;
  IncludeState *pIVar20;
  Conditional *pCVar21;
  Preprocessor *pPVar22;
  long lVar23;
  Preprocessor *__dest_00;
  bool bVar24;
  byte bVar25;
  void *local_e8;
  undefined8 local_98 [13];
  
  bVar25 = 0;
  if (*(int *)ctx == 0) {
    __dest_00 = ctx + 0xe;
    do {
      pIVar20 = *(IncludeState **)(ctx + 0x120);
      if (pIVar20 == (IncludeState *)0x0) {
        *token = TOKEN_EOI;
        *len = 0;
        return (char *)0x0;
      }
      if (pIVar20->conditional_stack == (Conditional *)0x0) {
        bVar24 = false;
      }
      else {
        bVar24 = pIVar20->conditional_stack->skipping != 0;
      }
      if (pIVar20->pushedback == 0) {
        TVar5 = preprocessor_lexer(pIVar20);
      }
      else {
        pIVar20->pushedback = 0;
        TVar5 = pIVar20->tokenval;
      }
      if (TVar5 == TOKEN_IDENTIFIER) {
switchD_00149dd0_caseD_11e:
        if (!bVar24) {
          switch(TVar5) {
          case TOKEN_PP_INCLUDE:
            handle_pp_include((Context_conflict1 *)ctx);
            break;
          case TOKEN_PP_LINE:
            handle_pp_line((Context_conflict1 *)ctx);
            break;
          case TOKEN_PP_DEFINE:
            pIVar20 = *(IncludeState **)(ctx + 0x120);
            if (pIVar20->pushedback == 0) {
              TVar5 = preprocessor_lexer(pIVar20);
            }
            else {
              pIVar20->pushedback = 0;
              TVar5 = pIVar20->tokenval;
            }
            if (TVar5 != TOKEN_IDENTIFIER) {
              pcVar16 = "Macro names must be identifiers";
              goto LAB_0014a20b;
            }
            __s1 = (byte *)(**(code **)(ctx + 0x960))
                                     (pIVar20->tokenlen + 1,*(undefined8 *)(ctx + 0x970));
            if (__s1 == (byte *)0x0) goto LAB_0014a13a;
            memcpy(__s1,pIVar20->token,(ulong)pIVar20->tokenlen);
            __s1[pIVar20->tokenlen] = 0;
            iVar6 = strcmp((char *)__s1,"defined");
            if (iVar6 == 0) {
              (**(code **)(ctx + 0x968))(__s1,*(undefined8 *)(ctx + 0x970));
              pcVar16 = "\'defined\' cannot be used as a macro name";
              goto LAB_0014a20b;
            }
            iVar6 = strcmp((char *)__s1,"__FILE__");
            pPVar22 = ctx + 0x938;
            if (((iVar6 == 0) ||
                (iVar6 = strcmp((char *)__s1,"__LINE__"), pPVar22 = ctx + 0x940, iVar6 == 0)) &&
               (*(long *)pPVar22 != 0)) {
              failf((Context_conflict1 *)ctx,"\'%s\' already defined",__s1);
              free_define((Context_conflict1 *)ctx,*(Define **)pPVar22);
              *(long *)pPVar22 = 0;
            }
            pIVar20->report_whitespace = 1;
            if (pIVar20->pushedback == 0) {
              preprocessor_lexer(pIVar20);
            }
            else {
              pIVar20->pushedback = 0;
            }
            pIVar20->report_whitespace = 0;
            if (pIVar20->tokenval == 0x28) {
              pIVar15 = pIVar20;
              puVar11 = local_98;
              for (lVar23 = 0xd; lVar23 != 0; lVar23 = lVar23 + -1) {
                *puVar11 = pIVar15->filename;
                pIVar15 = (IncludeState *)((long)pIVar15 + (ulong)bVar25 * -0x10 + 8);
                puVar11 = puVar11 + (ulong)bVar25 * -2 + 1;
              }
              uVar19 = 0;
              do {
                if (pIVar20->pushedback == 0) {
                  TVar5 = preprocessor_lexer(pIVar20);
                }
                else {
                  pIVar20->pushedback = 0;
                  TVar5 = pIVar20->tokenval;
                }
                if (TVar5 != TOKEN_IDENTIFIER) break;
                if (pIVar20->pushedback == 0) {
                  TVar5 = preprocessor_lexer(pIVar20);
                }
                else {
                  pIVar20->pushedback = 0;
                  TVar5 = pIVar20->tokenval;
                }
                uVar19 = uVar19 + 1;
              } while (TVar5 == 0x2c);
              if (pIVar20->tokenval == 0x29) {
                if (uVar19 == 0) {
                  uVar19 = 0xffffffff;
                  local_e8 = (void *)0x0;
                }
                else {
                  local_e8 = (void *)(**(code **)(ctx + 0x960))
                                               ((long)(int)uVar19 << 3 & 0xffffffff,
                                                *(undefined8 *)(ctx + 0x970));
                  if (local_e8 == (void *)0x0) {
                    *(undefined4 *)(ctx + 4) = 1;
                    goto LAB_0014a438;
                  }
                  puVar11 = local_98;
                  pIVar15 = pIVar20;
                  for (lVar23 = 0xd; lVar23 != 0; lVar23 = lVar23 + -1) {
                    pIVar15->filename = (char *)*puVar11;
                    puVar11 = puVar11 + (ulong)bVar25 * -2 + 1;
                    pIVar15 = (IncludeState *)((long)pIVar15 + (ulong)bVar25 * -0x10 + 8);
                  }
                  uVar14 = 0;
                  memset(local_e8,0,(long)(int)uVar19 << 3);
                  if ((int)uVar19 < 1) {
LAB_0014a772:
                    if ((uint)uVar14 != uVar19) {
                      if (*(int *)(ctx + 4) == 0) {
                        __assert_fail("ctx->out_of_memory",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                                      ,0x412,"void handle_pp_define(Context *)");
                      }
                      goto LAB_0014a43a;
                    }
                  }
                  else {
                    uVar14 = 0;
                    do {
                      if (pIVar20->pushedback == 0) {
                        preprocessor_lexer(pIVar20);
                      }
                      else {
                        pIVar20->pushedback = 0;
                      }
                      if (pIVar20->tokenval != TOKEN_IDENTIFIER) {
                        __assert_fail("state->tokenval == TOKEN_IDENTIFIER",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                                      ,0x3ff,"void handle_pp_define(Context *)");
                      }
                      __dest = (void *)(**(code **)(ctx + 0x960))
                                                 (pIVar20->tokenlen + 1,*(undefined8 *)(ctx + 0x970)
                                                 );
                      if (__dest == (void *)0x0) {
                        *(undefined4 *)(ctx + 4) = 1;
                        goto LAB_0014a772;
                      }
                      memcpy(__dest,pIVar20->token,(ulong)pIVar20->tokenlen);
                      *(undefined1 *)((long)__dest + (ulong)pIVar20->tokenlen) = 0;
                      *(void **)((long)local_e8 + uVar14 * 8) = __dest;
                      if (uVar14 < uVar19 - 1) {
                        if (pIVar20->pushedback == 0) {
                          preprocessor_lexer(pIVar20);
                        }
                        else {
                          pIVar20->pushedback = 0;
                        }
                        if (pIVar20->tokenval != 0x2c) {
                          __assert_fail("state->tokenval == ((Token) \',\')",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                                        ,0x40c,"void handle_pp_define(Context *)");
                        }
                      }
                      uVar14 = uVar14 + 1;
                    } while (uVar19 != uVar14);
                  }
                  if (pIVar20->pushedback == 0) {
                    preprocessor_lexer(pIVar20);
                  }
                  else {
                    pIVar20->pushedback = 0;
                  }
                  if (pIVar20->tokenval != 0x29) {
                    __assert_fail("state->tokenval == ((Token) \')\')",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                                  ,0x417,"void handle_pp_define(Context *)");
                  }
                }
                if (pIVar20->pushedback == 0) {
                  preprocessor_lexer(pIVar20);
                }
                else {
                  pIVar20->pushedback = 0;
                }
                goto LAB_0014a455;
              }
              failf((Context_conflict1 *)ctx,"%s","syntax error in macro parameter list");
LAB_0014a438:
              local_e8 = (void *)0x0;
LAB_0014a43a:
              pcVar16 = (char *)0x0;
            }
            else {
              if (pIVar20->tokenval == 0x20) {
                if (pIVar20->pushedback == 0) {
                  preprocessor_lexer(pIVar20);
                  goto LAB_0014a44a;
                }
                local_e8 = (void *)0x0;
                uVar19 = 0;
              }
              else {
LAB_0014a44a:
                uVar19 = 0;
                local_e8 = (void *)0x0;
LAB_0014a455:
                if (pIVar20->pushedback != 0) goto LAB_0014a945;
              }
              pIVar20->pushedback = 1;
              buffer = buffer_create(0x80,MallocBridge,FreeBridge,ctx);
              pIVar20->report_whitespace = 1;
              while (*(int *)(ctx + 4) == 0) {
                if (pIVar20->pushedback == 0) {
                  TVar5 = preprocessor_lexer(pIVar20);
                }
                else {
                  pIVar20->pushedback = 0;
                  TVar5 = pIVar20->tokenval;
                }
                bVar24 = true;
                if ((int)TVar5 < 0x11d) {
                  if (TVar5 != 0x20) {
                    if (TVar5 != 10) goto LAB_0014a4f7;
                    goto LAB_0014a50a;
                  }
                  sVar10 = buffer_size(buffer);
                  if (sVar10 == 0) {
                    __assert_fail("buffer_size(buffer) > 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                                  ,0x432,"void handle_pp_define(Context *)");
                  }
                  sVar10 = 1;
                  pcVar16 = " ";
                }
                else {
                  if ((TVar5 == TOKEN_INCOMPLETE_COMMENT) || (TVar5 == TOKEN_EOI)) {
                    if (pIVar20->pushedback != 0) goto LAB_0014a945;
                    pIVar20->pushedback = 1;
                    goto LAB_0014a50a;
                  }
LAB_0014a4f7:
                  pcVar16 = pIVar20->token;
                  sVar10 = (size_t)pIVar20->tokenlen;
                }
                buffer_append(buffer,pcVar16,sVar10);
              }
              bVar24 = false;
LAB_0014a50a:
              pIVar20->report_whitespace = 0;
              sVar10 = buffer_size(buffer);
              if (*(int *)(ctx + 4) == 0) {
                pcVar16 = buffer_flatten(buffer);
              }
              else {
                pcVar16 = (char *)0x0;
              }
              buffer_destroy(buffer);
              if (*(int *)(ctx + 4) == 0) {
                uVar14 = sVar10 + 1;
                if (2 < uVar14) {
                  bVar3 = true;
                  if ((*pcVar16 == '#') && (pcVar16[1] == '#')) {
                    uVar14 = sVar10 - 1;
                    memmove(pcVar16,pcVar16 + 2,uVar14);
                    if (2 < uVar14) {
                      bVar3 = false;
                      goto LAB_0014a5e8;
                    }
                  }
                  else {
LAB_0014a5e8:
                    pcVar18 = pcVar16 + (uVar14 - 2);
                    if ((((*pcVar18 == ' ') &&
                         (pcVar18 = pcVar16 + (uVar14 - 3), 0xfffffffffffffffc < uVar14 - 4)) ||
                        (*pcVar18 != '#')) || (pcVar18[-1] != '#')) {
                      if (bVar3) goto LAB_0014a64b;
                    }
                    else {
                      pcVar18[-1] = '\0';
                    }
                  }
                  failf((Context_conflict1 *)ctx,"%s",
                        "\'##\' cannot appear at either end of a macro expansion");
                }
LAB_0014a64b:
                if (!bVar24) {
                  __assert_fail("done",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                                ,0x461,"void handle_pp_define(Context *)");
                }
                bVar4 = *__s1;
                if (bVar4 == 0) {
                  uVar14 = 5;
                }
                else {
                  bVar13 = 5;
                  pbVar12 = __s1;
                  do {
                    pbVar12 = pbVar12 + 1;
                    bVar13 = bVar13 * '!' ^ bVar4;
                    bVar4 = *pbVar12;
                  } while (bVar4 != 0);
                  uVar14 = (ulong)bVar13;
                }
                for (puVar11 = *(undefined8 **)(ctx + uVar14 * 8 + 0x130);
                    puVar11 != (undefined8 *)0x0; puVar11 = (undefined8 *)puVar11[5]) {
                  iVar6 = strcmp((char *)*puVar11,(char *)__s1);
                  if (iVar6 == 0) {
                    failf((Context_conflict1 *)ctx,"\'%s\' already defined",__s1);
                    goto LAB_0014a548;
                  }
                }
                puVar11 = *(undefined8 **)(ctx + 0x930);
                if (puVar11 == (undefined8 *)0x0) {
                  puVar11 = (undefined8 *)
                            (**(code **)(ctx + 0x960))(0x30,*(undefined8 *)(ctx + 0x970));
                  if (puVar11 == (undefined8 *)0x0) {
                    *(undefined4 *)(ctx + 4) = 1;
                    goto LAB_0014a548;
                  }
                }
                else {
                  *(undefined8 *)(ctx + 0x930) = puVar11[5];
                }
                puVar11[4] = 0;
                puVar11[5] = 0;
                puVar11[1] = pcVar16;
                puVar11[2] = 0;
                *puVar11 = __s1;
                puVar11[3] = local_e8;
                *(uint *)(puVar11 + 4) = uVar19;
                puVar11[5] = *(undefined8 *)(ctx + uVar14 * 8 + 0x130);
                *(undefined8 **)(ctx + uVar14 * 8 + 0x130) = puVar11;
                break;
              }
            }
LAB_0014a548:
            (**(code **)(ctx + 0x968))(__s1,*(undefined8 *)(ctx + 0x970));
            (**(code **)(ctx + 0x968))(pcVar16,*(undefined8 *)(ctx + 0x970));
            if (local_e8 == (void *)0x0) {
              uVar17 = *(undefined8 *)(ctx + 0x970);
              local_e8 = (void *)0x0;
            }
            else {
              if (uVar19 != 0) {
                lVar23 = (long)(int)uVar19;
                do {
                  (**(code **)(ctx + 0x968))
                            (*(undefined8 *)((long)local_e8 + lVar23 * 8 + -8),
                             *(undefined8 *)(ctx + 0x970));
                  lVar23 = lVar23 + -1;
                } while (lVar23 != 0);
              }
              uVar17 = *(undefined8 *)(ctx + 0x970);
            }
            (**(code **)(ctx + 0x968))(local_e8,uVar17);
            break;
          case TOKEN_PP_UNDEF:
            handle_pp_undef((Context_conflict1 *)ctx);
            break;
          case TOKEN_PP_IF:
          case TOKEN_PP_IFDEF:
          case TOKEN_PP_IFNDEF:
          case TOKEN_PP_ELSE:
          case TOKEN_PP_ELIF:
          case TOKEN_PP_ENDIF:
            goto switchD_00149da4_caseD_124;
          case TOKEN_PP_ERROR:
            pIVar20 = *(IncludeState **)(ctx + 0x120);
            *(undefined4 *)(ctx + 0xb) = 0x726f72;
            *(undefined4 *)(ctx + 8) = 0x72726523;
            pIVar20->report_whitespace = 1;
            uVar19 = 0xf9;
            goto LAB_0014a813;
          case TOKEN_PP_PRAGMA:
            uVar8 = 1;
LAB_0014a89c:
            *(undefined4 *)(ctx + 0x110) = uVar8;
switchD_00149da4_caseD_124:
            *token = TVar5;
            *len = pIVar20->tokenlen;
            return pIVar20->token;
          default:
            if (TVar5 == 10) {
              if (*(int *)(ctx + 0x110) != 0) {
                uVar8 = 0;
                goto LAB_0014a89c;
              }
            }
            else if ((TVar5 != TOKEN_IDENTIFIER) ||
                    (iVar6 = handle_pp_identifier((Context_conflict1 *)ctx), iVar6 == 0))
            goto switchD_00149da4_caseD_124;
          }
        }
      }
      else {
        *(undefined4 *)(ctx + 0x108) = 0;
        switch(TVar5) {
        case TOKEN_EOI:
          if (pIVar20->bytes_left != 0) {
            __assert_fail("state->bytes_left == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                          ,0x7f7,
                          "const char *_preprocessor_nexttoken(Preprocessor *, unsigned int *, Token *)"
                         );
          }
          if (pIVar20->conditional_stack == (Conditional *)0x0) {
            pop_source((Context_conflict1 *)ctx);
          }
          else {
            pIVar20 = *(IncludeState **)(ctx + 0x120);
            pCVar21 = pIVar20->conditional_stack;
            uVar19 = pCVar21->type - TOKEN_PP_IF;
            if (4 < uVar19) {
              __assert_fail("0 && \"Shouldn\'t hit this case\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                            ,0x7c2,"void unterminated_pp_condition(Context *)");
            }
            failf((Context_conflict1 *)ctx,"%s",
                  &DAT_001607c4 + *(int *)(&DAT_001607c4 + (ulong)uVar19 * 4));
LAB_00149f01:
            pIVar20->conditional_stack = pCVar21->next;
            pCVar21->next = *(Conditional **)(ctx + 0x118);
            *(Conditional **)(ctx + 0x118) = pCVar21;
          }
          break;
        default:
          goto switchD_00149dd0_caseD_11e;
        case TOKEN_PP_IF:
          lVar23 = *(long *)(ctx + 0x120);
          iVar6 = reduce_pp_expression((Context_conflict1 *)ctx);
          if (iVar6 == -1) break;
          puVar11 = *(undefined8 **)(ctx + 0x118);
          if (puVar11 != (undefined8 *)0x0) {
            *(undefined8 *)(ctx + 0x118) = puVar11[2];
LAB_0014a0ef:
            *puVar11 = 0;
            puVar11[1] = 0;
            puVar11[2] = 0;
            lVar2 = *(long *)(lVar23 + 0x50);
            if ((lVar2 == 0) || (uVar19 = 1, *(int *)(lVar2 + 8) == 0)) {
              uVar19 = (uint)(iVar6 == 0);
            }
            *(undefined4 *)puVar11 = 0x124;
            *(int *)((long)puVar11 + 4) = *(int *)(lVar23 + 0x4c) + -1;
            *(uint *)(puVar11 + 1) = uVar19;
            *(int *)((long)puVar11 + 0xc) = iVar6;
            puVar11[2] = lVar2;
            *(undefined8 **)(lVar23 + 0x50) = puVar11;
            break;
          }
          puVar11 = (undefined8 *)(**(code **)(ctx + 0x960))(0x18,*(undefined8 *)(ctx + 0x970));
          if (puVar11 != (undefined8 *)0x0) goto LAB_0014a0ef;
LAB_0014a13a:
          *(undefined4 *)(ctx + 4) = 1;
          break;
        case TOKEN_PP_IFDEF:
          TVar5 = TOKEN_PP_IFDEF;
          goto LAB_00149f49;
        case TOKEN_PP_IFNDEF:
          TVar5 = TOKEN_PP_IFNDEF;
LAB_00149f49:
          _handle_pp_ifdef((Context_conflict1 *)ctx,TVar5);
          break;
        case TOKEN_PP_ELSE:
          pCVar21 = (*(IncludeState **)(ctx + 0x120))->conditional_stack;
          iVar6 = require_newline(*(IncludeState **)(ctx + 0x120));
          if (iVar6 == 0) {
            pcVar16 = "Invalid #else directive";
          }
          else if (pCVar21 == (Conditional *)0x0) {
            pcVar16 = "#else without #if";
          }
          else {
            if (pCVar21->type != TOKEN_PP_ELSE) {
              pCVar21->type = TOKEN_PP_ELSE;
              if ((pCVar21->next == (Conditional *)0x0) || (pCVar21->next->skipping == 0)) {
                iVar6 = pCVar21->chosen;
                uVar19 = (uint)(iVar6 != 0);
              }
              else {
                iVar6 = pCVar21->chosen;
                uVar19 = 1;
              }
              pCVar21->skipping = uVar19;
              if (iVar6 == 0) {
                pCVar21->chosen = 1;
              }
              break;
            }
            pcVar16 = "#else after #else";
          }
          goto LAB_0014a20b;
        case TOKEN_PP_ELIF:
          iVar6 = reduce_pp_expression((Context_conflict1 *)ctx);
          if (iVar6 != -1) {
            piVar1 = *(int **)(*(long *)(ctx + 0x120) + 0x50);
            if (piVar1 == (int *)0x0) {
              pcVar16 = "#elif without #if";
            }
            else {
              if (*piVar1 != 0x127) {
                *piVar1 = 0x128;
                if ((*(long *)(piVar1 + 4) == 0) || (*(int *)(*(long *)(piVar1 + 4) + 8) == 0)) {
                  if (piVar1[3] == 0) {
                    piVar1[2] = (uint)(iVar6 == 0);
                    goto LAB_0014a418;
                  }
                  piVar1[2] = 1;
                }
                else {
                  piVar1[2] = 1;
                  if (piVar1[3] == 0) {
LAB_0014a418:
                    piVar1[3] = iVar6;
                  }
                }
                break;
              }
              pcVar16 = "#elif after #else";
            }
            goto LAB_0014a20b;
          }
          break;
        case TOKEN_PP_ENDIF:
          pIVar20 = *(IncludeState **)(ctx + 0x120);
          pCVar21 = pIVar20->conditional_stack;
          iVar6 = require_newline(pIVar20);
          if (iVar6 == 0) {
            pcVar16 = "Invalid #endif directive";
          }
          else {
            if (pCVar21 != (Conditional *)0x0) goto LAB_00149f01;
            pcVar16 = "Unmatched #endif";
          }
          goto LAB_0014a20b;
        case TOKEN_INCOMPLETE_COMMENT:
          pcVar16 = "Incomplete multiline comment";
LAB_0014a20b:
          failf((Context_conflict1 *)ctx,"%s",pcVar16);
        }
      }
    } while (*(int *)ctx == 0);
  }
  goto LAB_00149cc1;
LAB_0014a813:
  while( true ) {
    uVar7 = uVar19;
    if (pIVar20->pushedback == 0) {
      TVar5 = preprocessor_lexer(pIVar20);
    }
    else {
      pIVar20->pushedback = 0;
      TVar5 = pIVar20->tokenval;
    }
    if (TVar5 != 0x20) break;
    uVar19 = 0;
    if (uVar7 != 0) {
      *__dest_00 = (Preprocessor)0x20;
      __dest_00 = __dest_00 + 1;
      uVar19 = uVar7 - 1;
    }
  }
  if ((TVar5 == TOKEN_INCOMPLETE_COMMENT) || (TVar5 == TOKEN_EOI)) goto LAB_0014a8c5;
  if (TVar5 == 10) goto LAB_0014a8c0;
  uVar19 = pIVar20->tokenlen;
  if ((int)uVar7 < (int)pIVar20->tokenlen) {
    uVar19 = uVar7;
  }
  if (uVar19 == 0) {
    sVar9 = 0;
  }
  else {
    sVar9 = (size_t)(int)uVar19;
    memcpy(__dest_00,pIVar20->token,sVar9);
  }
  __dest_00 = __dest_00 + sVar9;
  uVar19 = uVar7 - uVar19;
  goto LAB_0014a813;
LAB_0014a8c0:
  pIVar20->line = pIVar20->line - 1;
LAB_0014a8c5:
  if (pIVar20->pushedback != 0) {
LAB_0014a945:
    __assert_fail("!state->pushedback",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                  ,0x2d5,"void pushback(IncludeState *)");
  }
  pIVar20->pushedback = 1;
  *__dest_00 = (Preprocessor)0x0;
  pIVar20->report_whitespace = 0;
LAB_00149cc1:
  *(undefined4 *)ctx = 0;
  *token = TOKEN_PREPROCESSING_ERROR;
  sVar9 = strlen((char *)(ctx + 8));
  *len = (uint)sVar9;
  return (char *)(ctx + 8);
}

Assistant:

const char *preprocessor_nexttoken(Preprocessor *ctx, unsigned int *len,
                                   Token *token)
{
    const char *retval = _preprocessor_nexttoken(ctx, len, token);
    print_debug_token(retval, *len, *token);
    return retval;
}